

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **azData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMVar4;
  bool bVar5;
  RtreeNode *pNode;
  int iVar6;
  int iVar7;
  int iVar8;
  i64 iVar9;
  i64 iVar10;
  ulong uVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  RtreeNode *pLeaf;
  sqlite_int64 *local_68;
  RtreeCell cell;
  
  *(int *)&pVtab[2].zErrMsg = *(int *)&pVtab[2].zErrMsg + 1;
  cell.iRowid = 0;
  if (1 < nData) {
    iVar7 = 0;
    bVar5 = true;
    iVar8 = 0x13;
    local_68 = pRowid;
    if (pVtab[1].field_0xd == '\0') {
      uVar11 = 0;
      do {
        if ((uint)(byte)pVtab[1].field_0xc * 2 <= uVar11) goto LAB_00177f04;
        dVar12 = sqlite3VdbeRealValue(azData[uVar11 + 3]);
        fVar14 = (float)dVar12;
        if (dVar12 < (double)fVar14) {
          fVar14 = (float)(dVar12 * *(double *)(&DAT_00180d60 + (ulong)(dVar12 < 0.0) * 8));
        }
        cell.aCoord[uVar11].f = fVar14;
        dVar12 = sqlite3VdbeRealValue(azData[uVar11 + 4]);
        fVar13 = (float)dVar12;
        if ((double)fVar13 < dVar12) {
          fVar13 = (float)(dVar12 * *(double *)(&DAT_00180d70 + (ulong)(dVar12 < 0.0) * 8));
        }
        cell.aCoord[uVar11 + 1].f = fVar13;
        uVar11 = uVar11 + 2;
      } while (fVar14 <= fVar13);
    }
    else {
      uVar11 = 0;
      do {
        if ((uint)(byte)pVtab[1].field_0xc * 2 <= uVar11) goto LAB_00177f04;
        iVar9 = sqlite3VdbeIntValue(azData[uVar11 + 3]);
        cell.aCoord[uVar11].i = (int)iVar9;
        iVar10 = sqlite3VdbeIntValue(azData[uVar11 + 4]);
        cell.aCoord[uVar11 + 1].i = (int)iVar10;
        uVar11 = uVar11 + 2;
      } while ((int)iVar9 <= (int)iVar10);
    }
    goto LAB_00178098;
  }
  iVar7 = 0;
  bVar5 = true;
  goto LAB_00177fa8;
LAB_00177f04:
  pRowid = local_68;
  pMVar4 = azData[2];
  uVar1._0_2_ = pMVar4->flags;
  uVar1._2_1_ = pMVar4->enc;
  uVar1._3_1_ = pMVar4->field_0xb;
  if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
    iVar9 = sqlite3VdbeIntValue(pMVar4);
    pMVar4 = *azData;
    uVar2._0_2_ = pMVar4->flags;
    uVar2._2_1_ = pMVar4->enc;
    uVar2._3_1_ = pMVar4->field_0xb;
    cell.iRowid = iVar9;
    if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
      iVar10 = sqlite3VdbeIntValue(pMVar4);
      bVar5 = false;
      iVar7 = 0;
      if (iVar10 == iVar9) goto LAB_00177fa8;
    }
    sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].pModule,1,iVar9);
    iVar6 = sqlite3_step((sqlite3_stmt *)pVtab[5].pModule);
    iVar7 = sqlite3_reset((sqlite3_stmt *)pVtab[5].pModule);
    if (iVar6 == 100) {
      if (*(char *)((long)&(pVtab[1].pModule)->xEof + 5) != '\x05') goto LAB_00178098;
      iVar7 = rtreeDeleteRowid((Rtree *)pVtab,iVar9);
    }
    bVar5 = false;
  }
LAB_00177fa8:
  pMVar4 = *azData;
  uVar3._0_2_ = pMVar4->flags;
  uVar3._2_1_ = pMVar4->enc;
  uVar3._3_1_ = pMVar4->field_0xb;
  if ((0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) == 0) {
    iVar9 = sqlite3VdbeIntValue(pMVar4);
    iVar7 = rtreeDeleteRowid((Rtree *)pVtab,iVar9);
  }
  iVar8 = iVar7;
  if ((1 < nData) && (iVar7 == 0)) {
    pLeaf = (RtreeNode *)0x0;
    if (bVar5) {
      switchD_00112cbd::default(*(sqlite3_stmt **)&pVtab[5].nRef,1);
      switchD_00112cbd::default(*(sqlite3_stmt **)&pVtab[5].nRef,2);
      sqlite3_step(*(sqlite3_stmt **)&pVtab[5].nRef);
      iVar8 = sqlite3_reset(*(sqlite3_stmt **)&pVtab[5].nRef);
      cell.iRowid = (i64)(pVtab[1].pModule)->xOpen;
      *pRowid = cell.iRowid;
      if (iVar8 != 0) goto LAB_00178098;
    }
    else {
      *pRowid = cell.iRowid;
    }
    iVar8 = ChooseLeaf((Rtree *)pVtab,&cell,0,&pLeaf);
    pNode = pLeaf;
    if (iVar8 == 0) {
      *(undefined4 *)&pVtab[3].zErrMsg = 0xffffffff;
      iVar7 = rtreeInsertCell((Rtree *)pVtab,pLeaf,&cell,0);
      iVar8 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar7 != 0) {
        iVar8 = iVar7;
      }
    }
  }
LAB_00178098:
  rtreeRelease((Rtree *)pVtab);
  return iVar8;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **azData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;

    /* Populate the cell.aCoord[] array. The first coordinate is azData[3]. */
    assert( nData==(pRtree->nDim*2 + 3) );
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(azData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(azData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<(pRtree->nDim*2); ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(azData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(azData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = SQLITE_CONSTRAINT;
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(azData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(azData[2]);
      if( sqlite3_value_type(azData[0])==SQLITE_NULL
       || sqlite3_value_int64(azData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = SQLITE_CONSTRAINT;
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If azData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(azData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(azData[0]));
  }

  /* If the azData[] array contains more than one element, elements
  ** (azData[2]..azData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = newRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}